

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_parse_url_path(connectdata *conn)

{
  curl_ftpfile cVar1;
  bool bVar2;
  size_t sVar3;
  CURLcode CVar4;
  int iVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  Curl_easy *data;
  bool bVar12;
  char *rawPath;
  size_t pathLen;
  char *local_50;
  size_t local_48;
  Curl_easy *local_40;
  undefined8 *local_38;
  
  data = conn->data;
  local_38 = (undefined8 *)(data->req).protop;
  local_50 = (char *)0x0;
  local_48 = 0;
  (conn->proto).ftpc.ctl_valid = false;
  (conn->proto).ftpc.cwdfail = false;
  CVar4 = Curl_urldecode(data,(char *)*local_38,0,&local_50,&local_48,REJECT_CTRL);
  pcVar9 = local_50;
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  cVar1 = (data->set).ftp_filemethod;
  if (cVar1 == FTPFILE_SINGLECWD) {
    pcVar8 = strrchr(local_50,0x2f);
    pcVar7 = pcVar9;
    if (pcVar8 != (char *)0x0) {
      sVar10 = (long)pcVar8 - (long)pcVar9;
      if (sVar10 == 0) {
        sVar10 = 1;
      }
      ppcVar6 = (char **)(*Curl_ccalloc)(1,8);
      (conn->proto).ftpc.dirs = ppcVar6;
      if (ppcVar6 != (char **)0x0) {
        pcVar9 = (char *)(*Curl_ccalloc)(1,sVar10 + 1);
        *(conn->proto).ftpc.dirs = pcVar9;
        pcVar9 = *(conn->proto).ftpc.dirs;
        if (pcVar9 != (char *)0x0) {
          strncpy(pcVar9,local_50,sVar10);
          (conn->proto).ftpc.dirdepth = 1;
          bVar12 = true;
          pcVar9 = pcVar8 + 1;
          goto joined_r0x0011b8a0;
        }
      }
      (*Curl_cfree)(local_50);
      bVar12 = false;
      pcVar9 = (char *)0x0;
      goto joined_r0x0011b8a0;
    }
  }
  else {
    if (cVar1 != FTPFILE_NOCWD) {
      iVar5 = 0;
      pcVar7 = local_50;
      do {
        if (*pcVar7 == '/') {
          iVar5 = iVar5 + 1;
        }
        else if (*pcVar7 == '\0') goto LAB_0011b7ad;
        pcVar7 = pcVar7 + 1;
      } while( true );
    }
    if (local_48 == 0) {
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = (char *)0x0;
      if (local_50[local_48 - 1] != '/') {
        pcVar7 = pcVar9;
      }
    }
  }
  goto LAB_0011b8d8;
LAB_0011b7ad:
  local_40 = data;
  if (iVar5 < 1) {
    bVar12 = true;
  }
  else {
    ppcVar6 = (char **)(*Curl_ccalloc)((size_t)iVar5,8);
    (conn->proto).ftpc.dirs = ppcVar6;
    if (ppcVar6 == (char **)0x0) {
      (*Curl_cfree)(local_50);
      bVar12 = false;
      data = local_40;
      pcVar9 = (char *)0x0;
    }
    else {
      do {
        pcVar7 = strchr(pcVar9,0x2f);
        bVar12 = pcVar7 == (char *)0x0;
        data = local_40;
        if (bVar12) goto joined_r0x0011b8a0;
        sVar10 = (long)pcVar7 - (long)pcVar9;
        if (sVar10 == 0) {
          sVar10 = (size_t)((conn->proto).ftpc.dirdepth == 0);
        }
        if (sVar10 == 0) {
LAB_0011b86a:
          pcVar9 = pcVar7 + 1;
          bVar2 = true;
        }
        else {
          pcVar8 = (char *)(*Curl_ccalloc)(1,sVar10 + 1);
          if (pcVar8 != (char *)0x0) {
            strncpy(pcVar8,pcVar9,sVar10);
            iVar5 = (conn->proto).ftpc.dirdepth;
            (conn->proto).ftpc.dirdepth = iVar5 + 1;
            (conn->proto).ftpc.dirs[iVar5] = pcVar8;
            goto LAB_0011b86a;
          }
          (*Curl_cfree)(local_50);
          bVar2 = false;
        }
      } while (bVar2);
      data = local_40;
      pcVar9 = (char *)0x0;
    }
  }
joined_r0x0011b8a0:
  pcVar7 = pcVar9;
  if (!bVar12) {
    return CURLE_OUT_OF_MEMORY;
  }
LAB_0011b8d8:
  if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
    pcVar9 = (char *)0x0;
  }
  else {
    pcVar9 = (*Curl_cstrdup)(pcVar7);
  }
  sVar3 = local_48;
  (conn->proto).ftpc.file = pcVar9;
  if (((((data->set).field_0x97b & 0x20) != 0) && ((conn->proto).ftpc.file == (char *)0x0)) &&
     (*(int *)(local_38 + 2) == 0)) {
    Curl_failf(data,"Uploading to a URL without a file name!");
    (*Curl_cfree)(local_50);
    return CURLE_URL_MALFORMAT;
  }
  (conn->proto).ftpc.cwddone = false;
  cVar1 = (data->set).ftp_filemethod;
  if ((cVar1 != FTPFILE_NOCWD) || (*local_50 != '/')) {
    if (((conn->bits).field_0x4 & 0x40) == 0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (conn->proto).ftpc.prevpath;
    }
    if (pcVar9 == (char *)0x0) goto LAB_0011b9b8;
    if (cVar1 == FTPFILE_NOCWD) {
      sVar10 = 0;
    }
    else {
      pcVar7 = (conn->proto).ftpc.file;
      if (pcVar7 == (char *)0x0) {
        sVar10 = 0;
      }
      else {
        sVar10 = strlen(pcVar7);
      }
      sVar10 = sVar3 - sVar10;
    }
    sVar11 = strlen(pcVar9);
    if ((sVar11 != sVar10) || (iVar5 = strncmp(local_50,pcVar9,sVar10), iVar5 != 0))
    goto LAB_0011b9b8;
    Curl_infof(data,"Request has same path as previous transfer\n");
  }
  (conn->proto).ftpc.cwddone = true;
LAB_0011b9b8:
  (*Curl_cfree)(local_50);
  return CURLE_OK;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slashPos = NULL;
  const char *fileName = NULL;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL; /* url-decoded "raw" path */
  size_t pathLen = 0;

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  /* url-decode ftp path before further evaluation */
  result = Curl_urldecode(data, ftp->path, 0, &rawPath, &pathLen, REJECT_CTRL);
  if(result)
    return result;

  switch(data->set.ftp_filemethod) {
    case FTPFILE_NOCWD: /* fastest, but less standard-compliant */

      if((pathLen > 0) && (rawPath[pathLen - 1] != '/'))
          fileName = rawPath;  /* this is a full file path */
      /*
        else: ftpc->file is not used anywhere other than for operations on
              a file. In other words, never for directory operations.
              So we can safely leave filename as NULL here and use it as a
              argument in dir/file decisions.
      */
      break;

    case FTPFILE_SINGLECWD:
      slashPos = strrchr(rawPath, '/');
      if(slashPos) {
        /* get path before last slash, except for / */
        size_t dirlen = slashPos - rawPath;
        if(dirlen == 0)
            dirlen++;

        ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        ftpc->dirs[0] = calloc(1, dirlen + 1);
        if(!ftpc->dirs[0]) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        strncpy(ftpc->dirs[0], rawPath, dirlen);
        ftpc->dirdepth = 1; /* we consider it to be a single dir */
        fileName = slashPos + 1; /* rest is file name */
      }
      else
        fileName = rawPath; /* file name only (or empty) */
      break;

    default: /* allow pretty much anything */
    case FTPFILE_MULTICWD: {
      /* current position: begin of next path component */
      const char *curPos = rawPath;

      int dirAlloc = 0; /* number of entries allocated for the 'dirs' array */
      const char *str = rawPath;
      for(; *str != 0; ++str)
        if (*str == '/')
          ++dirAlloc;

      if(dirAlloc > 0) {
        ftpc->dirs = calloc(dirAlloc, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        /* parse the URL path into separate path components */
        while((slashPos = strchr(curPos, '/')) != NULL) {
          size_t compLen = slashPos - curPos;

          /* path starts with a slash: add that as a directory */
          if((compLen == 0) && (ftpc->dirdepth == 0))
            ++compLen;

          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) doesn't
             work on many servers and b) has no effect on the others. */
          if(compLen > 0) {
            char *comp = calloc(1, compLen + 1);
            if(!comp) {
              free(rawPath);
              return CURLE_OUT_OF_MEMORY;
            }
            strncpy(comp, curPos, compLen);
            ftpc->dirs[ftpc->dirdepth++] = comp;
          }
          curPos = slashPos + 1;
        }
      }
      DEBUGASSERT(ftpc->dirdepth <= dirAlloc);
      fileName = curPos; /* the rest is the file name (or empty) */
    }
    break;
  } /* switch */

  if(fileName && *fileName)
    ftpc->file = strdup(fileName);
  else
    ftpc->file = NULL; /* instead of point to a zero byte,
                            we make it a NULL pointer */

  if(data->set.upload && !ftpc->file && (ftp->transfer == FTPTRANSFER_BODY)) {
    /* We need a file name when uploading. Return error! */
    failf(data, "Uploading to a URL without a file name!");
    free(rawPath);
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
    ftpc->cwddone = TRUE; /* skip CWD for absolute paths */
  else { /* newly created FTP connections are already in entry path */
    const char *oldPath = conn->bits.reuse ? ftpc->prevpath : "";
    if(oldPath) {
      size_t n = pathLen;
      if(data->set.ftp_filemethod == FTPFILE_NOCWD)
        n = 0; /* CWD to entry for relative paths */
      else
        n -= ftpc->file?strlen(ftpc->file):0;

      if((strlen(oldPath) == n) && !strncmp(rawPath, oldPath, n)) {
        infof(data, "Request has same path as previous transfer\n");
        ftpc->cwddone = TRUE;
      }
    }
  }

  free(rawPath);
  return CURLE_OK;
}